

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::alloc_temp_regs(size_t prec,size_t cnt,...)

{
  char in_AL;
  char *pcVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint *hdl_ptr;
  char **ext_ptr;
  int failed;
  size_t i;
  va_list marker;
  undefined8 *local_158;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  size_t in_stack_fffffffffffffec0;
  undefined8 *puVar3;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  long *local_40;
  int local_34;
  ulong local_30;
  uint local_28;
  undefined4 local_24;
  undefined8 *local_20;
  undefined1 *local_18;
  ulong local_10;
  undefined8 local_8;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_18 = local_f8;
  local_20 = (undefined8 *)&stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_34 = 0;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
    if (local_28 < 0x29) {
      local_110 = (undefined8 *)(local_18 + (int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_110 = local_20;
      local_20 = local_20 + 1;
    }
    local_40 = (long *)*local_110;
    if (local_28 < 0x29) {
      local_128 = (undefined8 *)(local_18 + (int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_128 = local_20;
      local_20 = local_20 + 1;
    }
    local_48 = *local_128;
    pcVar1 = alloc_temp_reg(in_stack_fffffffffffffec0,
                            (uint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    *local_40 = (long)pcVar1;
    if (*local_40 == 0) {
      local_34 = 1;
    }
  }
  if (local_34 != 0) {
    local_18 = local_f8;
    local_20 = (undefined8 *)&stack0x00000008;
    local_24 = 0x30;
    local_28 = 0x10;
    for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
      if (local_28 < 0x29) {
        lVar2 = (long)(int)local_28;
        local_28 = local_28 + 8;
        puVar3 = (undefined8 *)(local_18 + lVar2);
      }
      else {
        puVar3 = local_20;
        local_20 = local_20 + 1;
      }
      local_40 = (long *)*puVar3;
      if (local_28 < 0x29) {
        local_158 = (undefined8 *)(local_18 + (int)local_28);
        local_28 = local_28 + 8;
      }
      else {
        local_158 = local_20;
        local_20 = local_20 + 1;
      }
      local_48 = *local_158;
      if (*local_40 != 0) {
        release_temp_reg(0);
      }
    }
    err_throw(0);
  }
  return;
}

Assistant:

void CVmObjBigNum::alloc_temp_regs(size_t prec, size_t cnt, ...)
{
    va_list marker;
    size_t i;
    int failed;
    char **ext_ptr;
    uint *hdl_ptr;

    /* set up to read varargs */
    va_start(marker, cnt);

    /* no failures yet */
    failed = FALSE;

    /* scan the varargs list */
    for (i = 0 ; i < cnt ; ++i)
    {
        /* get the next argument */
        ext_ptr = va_arg(marker, char **);
        hdl_ptr = va_arg(marker, uint *);

        /* allocate a register */
        *ext_ptr = alloc_temp_reg(prec, hdl_ptr);

        /* if this allocation failed, note it, but keep going for now */
        if (*ext_ptr == 0)
            failed = TRUE;
    }

    /* done reading argument */
    va_end(marker);

    /* if we had any failures, free all of the registers we allocated */
    if (failed)
    {
        /* restart reading the varargs */
        va_start(marker, cnt);

        /* scan the varargs and free the successfully allocated registers */
        for (i = 0 ; i < cnt ; ++i)
        {
            /* get the next argument */
            ext_ptr = va_arg(marker, char **);
            hdl_ptr = va_arg(marker, uint *);

            /* free this register if we successfully allocated it */
            if (*ext_ptr != 0)
                release_temp_reg(*hdl_ptr);
        }

        /* done reading varargs */
        va_end(marker);

        /* throw the error */
        err_throw(VMERR_BIGNUM_NO_REGS);
    }
}